

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O2

ngram_model_t *
ngram_model_set_add(ngram_model_t *base,ngram_model_t *model,char *name,float32 weight,
                   int reuse_widmap)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int32 iVar4;
  uint32 *puVar5;
  void *pvVar6;
  char *pcVar7;
  logmath_t *plVar8;
  long lVar9;
  
  iVar3 = base[1].refcount;
  base[1].refcount = iVar3 + 1;
  puVar5 = (uint32 *)
           __ckd_realloc__(base[1].n_counts,(long)iVar3 * 8 + 8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                           ,0x217);
  base[1].n_counts = puVar5;
  iVar3 = base[1].refcount;
  *(ngram_model_t **)(puVar5 + (long)iVar3 * 2 + -2) = model;
  pvVar6 = __ckd_realloc__(*(void **)&base[1].n_1g_alloc,(long)iVar3 << 3,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                           ,0x21a);
  *(void **)&base[1].n_1g_alloc = pvVar6;
  pcVar7 = __ckd_salloc__(name,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                          ,0x21b);
  iVar3 = base[1].refcount;
  lVar9 = (long)iVar3;
  *(char **)(*(long *)&base[1].n_1g_alloc + -8 + lVar9 * 8) = pcVar7;
  if (base->n < model->n) {
    base->n = model->n;
    pvVar6 = __ckd_realloc__(*(void **)&base[1].lw,(ulong)model->n * 4 - 4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                             ,0x220);
    *(void **)&base[1].lw = pvVar6;
    iVar3 = base[1].refcount;
    lVar9 = (long)iVar3;
  }
  pvVar6 = __ckd_realloc__(*(void **)&base[1].n,lVar9 << 2,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                           ,0x226);
  *(void **)&base[1].n = pvVar6;
  iVar2 = logmath_log(base->lmath,(float64)(double)((float)weight / (float)iVar3));
  *(int *)(*(long *)&base[1].n + -4 + (long)base[1].refcount * 4) = iVar2;
  iVar3 = logmath_log(base->lmath,(float64)(1.0 - (double)((float)weight / (float)iVar3)));
  for (lVar9 = 0; lVar9 < (long)((long)base[1].refcount - 1U); lVar9 = lVar9 + 1) {
    piVar1 = (int *)(*(long *)&base[1].n + lVar9 * 4);
    *piVar1 = *piVar1 + iVar3;
  }
  if (reuse_widmap == 0) {
    build_widmap(base,base->lmath,(uint)base->n);
  }
  else {
    plVar8 = (logmath_t *)
             __ckd_calloc_2d__((long)base->n_words,(long)base[1].refcount,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                               ,0x235);
    for (lVar9 = 0; lVar9 < base->n_words; lVar9 = lVar9 + 1) {
      memcpy((&(plVar8->t).table)[lVar9],(&((base[1].lmath)->t).table)[lVar9],
             (long)base[1].refcount * 4 - 4);
      iVar4 = ngram_wid(model,base->word_str[lVar9]);
      *(int32 *)((long)(&(plVar8->t).table)[lVar9] + (long)base[1].refcount * 4 + -4) = iVar4;
    }
    ckd_free_2d(base[1].lmath);
    base[1].lmath = plVar8;
  }
  return model;
}

Assistant:

ngram_model_t *
ngram_model_set_add(ngram_model_t * base,
                    ngram_model_t * model,
                    const char *name, float32 weight, int reuse_widmap)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    float32 fprob;
    int32 scale, i;

    /* Add it to the array of lms. */
    ++set->n_models;
    set->lms = ckd_realloc(set->lms, set->n_models * sizeof(*set->lms));
    set->lms[set->n_models - 1] = model;
    set->names =
        ckd_realloc(set->names, set->n_models * sizeof(*set->names));
    set->names[set->n_models - 1] = ckd_salloc(name);
    /* Expand the history mapping table if necessary. */
    if (model->n > base->n) {
        base->n = model->n;
        set->maphist = ckd_realloc(set->maphist,
                                   (model->n - 1) * sizeof(*set->maphist));
    }

    /* Renormalize the interpolation weights. */
    fprob = weight * 1.0f / set->n_models;
    set->lweights = ckd_realloc(set->lweights,
                                set->n_models * sizeof(*set->lweights));
    set->lweights[set->n_models - 1] = logmath_log(base->lmath, fprob);
    /* Now normalize everything else to fit it in.  This is
     * accomplished by simply scaling all the other probabilities
     * by (1-fprob). */
    scale = logmath_log(base->lmath, 1.0 - fprob);
    for (i = 0; i < set->n_models - 1; ++i)
        set->lweights[i] += scale;

    /* Reuse the old word ID mapping if requested. */
    if (reuse_widmap) {
        int32 **new_widmap;

        /* Tack another column onto the widmap array. */
        new_widmap = (int32 **) ckd_calloc_2d(base->n_words, set->n_models,
                                              sizeof(**new_widmap));
        for (i = 0; i < base->n_words; ++i) {
            /* Copy all the existing mappings. */
            memcpy(new_widmap[i], set->widmap[i],
                   (set->n_models - 1) * sizeof(**new_widmap));
            /* Create the new mapping. */
            new_widmap[i][set->n_models - 1] =
                ngram_wid(model, base->word_str[i]);
        }
        ckd_free_2d((void **) set->widmap);
        set->widmap = new_widmap;
    }
    else {
        build_widmap(base, base->lmath, base->n);
    }
    return model;
}